

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O2

void Gia_ManCheckIntegrityWithBoxes(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  Vec_Int_t *p_00;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  
  if (p->pManTime != (void *)0x0) {
    Gia_ManCreateRefs(p);
    iVar6 = p->vCos->nSize;
    iVar2 = p->nRegs;
    iVar1 = Gia_ManRegBoxNum(p);
    uVar5 = 0;
    for (iVar6 = iVar6 - (iVar1 + iVar2); iVar6 < p->vCos->nSize - p->nRegs; iVar6 = iVar6 + 1) {
      pGVar3 = Gia_ManPo(p,iVar6);
      uVar4 = (ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff);
      if ((~*(uint *)(pGVar3 + -uVar4) & 0x9fffffff) != 0) {
        __assert_fail("Gia_ObjIsCi(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweep.c"
                      ,0x1ac,"void Gia_ManCheckIntegrityWithBoxes(Gia_Man_t *)");
      }
      iVar2 = Gia_ObjRefNum(p,pGVar3 + -uVar4);
      uVar5 = uVar5 + (1 < iVar2);
    }
    p_00 = Gia_ManComputeCarryOuts(p);
    iVar6 = p_00->nSize;
    iVar2 = 0;
    if (iVar6 < 1) {
      iVar6 = 0;
    }
    uVar7 = 0;
    for (; iVar6 != iVar2; iVar2 = iVar2 + 1) {
      iVar1 = Vec_IntEntry(p_00,iVar2);
      pGVar3 = Gia_ManObj(p,iVar1);
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      iVar1 = Gia_ObjRefNum(p,pGVar3);
      uVar7 = uVar7 + (1 < iVar1);
    }
    Vec_IntFree(p_00);
    if (uVar5 != 0 || uVar7 != 0) {
      printf("Warning: AIG with boxes has internal fanout in %d complex flops and %d carries.\n",
             (ulong)uVar5,(ulong)uVar7);
    }
    if (p->pRefs != (int *)0x0) {
      free(p->pRefs);
      p->pRefs = (int *)0x0;
    }
  }
  return;
}

Assistant:

void Gia_ManCheckIntegrityWithBoxes( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    Vec_Int_t * vCarryOuts;
    int i, nCountReg = 0, nCountCarry = 0;
    if ( p->pManTime == NULL )
        return;
    Gia_ManCreateRefs( p );
    for ( i = Gia_ManPoNum(p) - Gia_ManRegBoxNum(p); i < Gia_ManPoNum(p); i++ )
    {
        pObj = Gia_ObjFanin0( Gia_ManPo(p, i) );
        assert( Gia_ObjIsCi(pObj) );
        if ( Gia_ObjRefNum(p, pObj) > 1 )
            nCountReg++;
    }
    vCarryOuts = Gia_ManComputeCarryOuts( p );
    Gia_ManForEachObjVec( vCarryOuts, p, pObj, i )
        if ( Gia_ObjRefNum(p, pObj) > 1 )
            nCountCarry++;
    Vec_IntFree( vCarryOuts );
    if ( nCountReg || nCountCarry )
        printf( "Warning: AIG with boxes has internal fanout in %d complex flops and %d carries.\n", nCountReg, nCountCarry );
    ABC_FREE( p->pRefs );
}